

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O3

void __thiscall DriverTest_PutGet_Test::~DriverTest_PutGet_Test(DriverTest_PutGet_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_P(DriverTest, PutGet)
{
    Arbiter a;

    const std::string root(GetParam());
    const std::string path(root + "test.txt");
    const std::string data("Testing path " + path);

    if (a.isLocal(root)) mkdirp(root);

    EXPECT_NO_THROW(a.put(path, data));
    EXPECT_EQ(a.get(path), data);
}